

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::ReadableDirectory::Entry>::~Array(Array<kj::ReadableDirectory::Entry> *this)

{
  Array<kj::ReadableDirectory::Entry> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }